

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O3

string * __thiscall
ResponseBase::attribute<unsigned_long>
          (string *__return_storage_ptr__,ResponseBase *this,char *name,unsigned_long *value)

{
  size_t sVar1;
  ostream *poVar2;
  ostringstream stream;
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[",1);
  if (name == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar1 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,": ",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string attribute(const char* name, const T& value) const {
        std::ostringstream stream;
        stream << "[" << name << ": " << value << "]";
        return stream.str();
    }